

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_json_visitor<wchar_t>::visit_typed_array
          (basic_json_visitor<wchar_t> *this,span<const_float,_18446744073709551615UL> *s,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  float *pfVar1;
  undefined7 in_register_00000011;
  float *pfVar2;
  
  (*this->_vptr_basic_json_visitor[7])(this,s->size_,CONCAT71(in_register_00000011,tag));
  pfVar1 = s->data_;
  for (pfVar2 = pfVar1; pfVar2 != pfVar1 + s->size_; pfVar2 = pfVar2 + 1) {
    (*this->_vptr_basic_json_visitor[0x12])((double)*pfVar2,this,0,context,ec);
    pfVar1 = s->data_;
  }
  (*this->_vptr_basic_json_visitor[8])(this,context,ec);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const float>& s, 
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec)  
        {
            begin_array(s.size(), tag,context, ec);
            for (auto p = s.begin(); p != s.end(); ++p)
            {
                double_value(*p,semantic_tag::none,context, ec);
            }
            end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }